

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

bool __thiscall soul::RenderingVenue::Pimpl::createSession(Pimpl *this,SessionReadyCallback *cb)

{
  _Manager_type p_Var1;
  _Any_data _Stack_58;
  code *local_48;
  anon_class_40_2_28a14680 local_38;
  
  local_38.callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.callback.super__Function_base._M_functor._8_8_ = 0;
  local_38.callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_38.callback._M_invoker = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38.callback.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_38.callback.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_38.callback.super__Function_base._M_manager = p_Var1;
  }
  local_38.this = this;
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::createSession(std::function<void(std::unique_ptr<soul::Venue::Session,std::default_delete<soul::Venue::Session>>)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)_Stack_58._M_pod_data,&local_38);
  TaskThread::Queue::addTask(&this->createSessionQueue,(TaskFunction *)&_Stack_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  if (local_38.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.callback.super__Function_base._M_manager)
              ((_Any_data *)&local_38.callback,(_Any_data *)&local_38.callback,__destroy_functor);
  }
  return true;
}

Assistant:

bool createSession (SessionReadyCallback cb)
    {
        createSessionQueue.addTask ([this, callback = std::move (cb)] (TaskThread::ShouldStopFlag&)
        {
            callback (std::make_unique<Pimpl::SessionImpl> (*this, performerFactory->createPerformer()));
        });

        return true;
    }